

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageloader.cpp
# Opt level: O0

_anonymous_namespace_ * __thiscall
stackjit::(anonymous_namespace)::loadString_abi_cxx11_
          (_anonymous_namespace_ *this,BinaryData *data,size_t *index)

{
  unsigned_long uVar1;
  undefined8 local_48;
  size_t i;
  unsigned_long size;
  size_t *index_local;
  BinaryData *data_local;
  string *str;
  
  uVar1 = anon_unknown_5::loadData<unsigned_long>(data,index);
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::reserve((ulong)this);
  local_48 = 0;
  while (local_48 < uVar1) {
    std::vector<char,_std::allocator<char>_>::at(data,*index);
    std::__cxx11::string::push_back((char)this);
    local_48 = local_48 + 1;
    *index = *index + 1;
  }
  return this;
}

Assistant:

std::string loadString(BinaryData& data, std::size_t& index) {
			auto size = loadData<std::size_t>(data, index);
			std::string str;
			str.reserve(size);

			for (std::size_t i = 0; i < size; i++, index++) {
				str.push_back(data.at(index));
			}

			return str;
		}